

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

Belief * __thiscall despot::Tag::ExactPrior(Tag *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TagBelief *pTVar4;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_70;
  TagBelief *local_58;
  TagBelief *belief;
  TagBelief *local_48;
  TagState *state;
  int opp;
  int local_2c;
  undefined1 local_28 [4];
  int rob;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  Tag *this_local;
  
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_28);
  local_2c = 0;
  while( true ) {
    iVar2 = local_2c;
    iVar1 = despot::Floor::NumCells();
    if (iVar1 <= iVar2) break;
    state._0_4_ = 0;
    while( true ) {
      iVar2 = (int)state;
      iVar1 = despot::Floor::NumCells();
      if (iVar1 <= iVar2) break;
      iVar2 = BaseTag::RobOppIndicesToStateIndex(&this->super_BaseTag,local_2c,(int)state);
      iVar1 = despot::Floor::NumCells();
      iVar3 = despot::Floor::NumCells();
      belief = (TagBelief *)
               BaseTag::Allocate(&this->super_BaseTag,iVar2,(1.0 / (double)iVar1) / (double)iVar3);
      local_48 = belief;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_28,
                 (value_type *)&belief);
      state._0_4_ = (int)state + 1;
    }
    local_2c = local_2c + 1;
  }
  pTVar4 = (TagBelief *)operator_new(0x98);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&local_70,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_28);
  TagBelief::TagBelief(pTVar4,&local_70,&this->super_BaseTag,(Belief *)0x0);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_70);
  local_58 = pTVar4;
  despot::ParticleBelief::state_indexer((StateIndexer *)pTVar4);
  pTVar4 = local_58;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_28);
  return (Belief *)pTVar4;
}

Assistant:

Belief* Tag::ExactPrior() const {
	vector<State*> particles;
	for (int rob = 0; rob < floor_.NumCells(); rob++) {
		for (int opp = 0; opp < floor_.NumCells(); opp++) {
			TagState* state = static_cast<TagState*>(BaseTag::Allocate(
				RobOppIndicesToStateIndex(rob, opp),
				1.0 / floor_.NumCells() / floor_.NumCells()));
			particles.push_back(state);
		}
	}

	TagBelief* belief = new TagBelief(particles, this);
	belief->state_indexer(this);
	return belief;
}